

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O3

int minimalFlip1(word *pInOut,word *pMinimal,word *PDuplicat,int nVars)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  word *__src;
  word *__dest;
  size_t __n;
  
  iVar3 = Kit_TruthWordNum_64bit(nVars);
  __n = (size_t)(iVar3 << 3);
  memcpy(pMinimal,pInOut,__n);
  memcpy(PDuplicat,pInOut,__n);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  if (1 < nVars) {
    iVar3 = 1;
    do {
      uVar4 = Kit_TruthWordNum_64bit(nVars);
      uVar5 = (ulong)uVar4;
      do {
        __src = pMinimal;
        __dest = pInOut;
        if ((int)uVar5 < 1) goto LAB_0090e652;
        lVar1 = uVar5 - 1;
        lVar2 = uVar5 - 1;
        uVar5 = uVar5 - 1;
      } while (pMinimal[lVar2] == pInOut[lVar1]);
      if (pInOut[lVar1] < pMinimal[lVar2]) {
        __src = pInOut;
        __dest = pMinimal;
      }
LAB_0090e652:
      memcpy(__dest,__src,__n);
      Kit_TruthChangePhase_64bit(pInOut,nVars,iVar3);
      iVar3 = iVar3 + 1;
    } while (iVar3 != nVars);
  }
  uVar4 = Kit_TruthWordNum_64bit(nVars);
  uVar5 = (ulong)uVar4;
  do {
    if ((int)uVar5 < 1) goto LAB_0090e69f;
    lVar1 = uVar5 - 1;
    lVar2 = uVar5 - 1;
    uVar5 = uVar5 - 1;
  } while (pMinimal[lVar2] == pInOut[lVar1]);
  if (pMinimal[lVar2] <= pInOut[lVar1]) {
    memcpy(pInOut,pMinimal,__n);
  }
LAB_0090e69f:
  iVar3 = bcmp(pInOut,PDuplicat,__n);
  return (int)(iVar3 != 0);
}

Assistant:

int minimalFlip1(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars) 
{
    int i;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, (size_t)blockSize);
    memcpy(PDuplicat, pInOut, (size_t)blockSize);
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
        memcpy(pInOut, pMinimal, (size_t)blockSize);
    if(memcmp(pInOut,PDuplicat,(size_t)blockSize) == 0)
        return 0;
    else
        return 1;
}